

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.cpp
# Opt level: O3

void * MissionLogThread(void *pParam)

{
  FILE *__stream;
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  timespec local_68;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  do {
    local_68.tv_sec = 0;
    local_68.tv_nsec = 100000000;
    nanosleep(&local_68,(timespec *)0x0);
    pthread_mutex_lock((pthread_mutex_t *)&MissionFilesCS);
    if ((bMissionRunning != 0) && (logmissionfile != (FILE *)0x0)) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      dVar6 = angle_env;
      local_38 = lat_env;
      local_48 = long_env;
      dVar4 = Center((interval *)&xhat);
      local_40 = Center((interval *)&yhat);
      Center((interval *)&zhat);
      local_50 = cos(dVar6);
      local_58 = sin(dVar6);
      dVar3 = sin(dVar6);
      dVar6 = cos(dVar6);
      dVar6 = ((dVar3 * dVar4 + dVar6 * local_40) / 6371000.0) * 57.29577951308232 + local_38;
      dVar3 = 0.0;
      if ((2.220446049250313e-16 <= ABS(dVar6 + -90.0)) &&
         (2.220446049250313e-16 <= ABS(dVar6 + 90.0))) {
        dVar5 = local_40 * local_58;
        dVar4 = dVar4 * local_50;
        dVar3 = cos(dVar6 * 0.017453292519943295);
        dVar3 = local_48 + (((dVar4 - dVar5) / 6371000.0) * 57.29577951308232) / dVar3;
      }
      Center((interval *)&zhat);
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      __stream = logmissionfile;
      lVar2 = chrono_mission.Duration.tv_sec;
      lVar1 = chrono_mission.Duration.tv_nsec;
      if (chrono_mission.Suspended == 0) {
        clock_gettime(4,&local_68);
        lVar2 = ((local_68.tv_sec + chrono_mission.Duration.tv_sec) - chrono_mission.Start.tv_sec) +
                (local_68.tv_nsec + chrono_mission.Duration.tv_nsec) / 1000000000;
        lVar1 = (local_68.tv_nsec + chrono_mission.Duration.tv_nsec) % 1000000000 -
                chrono_mission.Start.tv_nsec;
        if (lVar1 < 0) {
          lVar2 = lVar2 + ~((ulong)-lVar1 / 1000000000);
          lVar1 = lVar1 + 1000000000 + ((ulong)-lVar1 / 1000000000) * 1000000000;
        }
      }
      fprintf((FILE *)__stream,"%f;%f;%f;%f;%s;\n",
              SUB84((double)lVar1 / 1000000000.0 + (double)lVar2,0),dVar6,dVar3,szAction);
      fflush((FILE *)logmissionfile);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&MissionFilesCS);
  } while (bExit == 0);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE MissionLogThread(void* pParam)
{
	double lathat = 0, longhat = 0, althat = 0, depthhat = 0;

	UNREFERENCED_PARAMETER(pParam);

	for (;;)
	{
		mSleep(100);

		EnterCriticalSection(&MissionFilesCS);
		if (bMissionRunning&&(logmissionfile != NULL))
		{
			EnterCriticalSection(&StateVariablesCS);
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(xhat), Center(yhat), Center(zhat), &lathat, &longhat, &althat);
			depthhat = -Center(zhat);
			LeaveCriticalSection(&StateVariablesCS);

			// szAction is not protected and might be temporarily invalid when it is changing, 
			// but this should not cause a crash...

			fprintf(logmissionfile, "%f;%f;%f;%f;%s;\n",
				GetTimeElapsedChronoQuick(&chrono_mission), lathat, longhat, depthhat, szAction
			);
			fflush(logmissionfile);
		}
		LeaveCriticalSection(&MissionFilesCS);

		if (bExit) break;
	}

	return 0;
}